

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> * __thiscall
Corrade::Utility::Configuration::parse
          (pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>
           *__return_storage_ptr__,Configuration *this,StringView in,ConfigurationGroup *group,
          StringView fullPath)

{
  byte *pbVar1;
  pointer pVVar2;
  size_type sVar3;
  StringView fullPath_00;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  ConfigurationGroup *pCVar7;
  char *pcVar8;
  ostream *poVar9;
  string *psVar10;
  size_t sVar11;
  StringView in_00;
  BasicStringView<const_char> BVar12;
  StringView SVar13;
  StringView SVar14;
  StringView a;
  StringView local_158;
  Value item;
  StringView local_f8;
  char *local_e8;
  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
  *local_e0;
  StringView nextSubGroup;
  StringView nextGroup;
  Array3<Containers::StringView> keyValue;
  anon_union_24_2_2c69c8ed_for_String_0 local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  BasicStringView<const_char> local_50;
  char *local_40;
  size_t sStack_38;
  
  local_158 = in;
  if (((fullPath._data != (char *)0x0) &&
      (((undefined1  [16])fullPath & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0)
      ) && (bVar5 = Containers::BasicStringView<const_char>::hasSuffix(&fullPath,'/'), !bVar5)) {
    poVar9 = Error::defaultOutput();
    Error::Error((Error *)&item,poVar9,(Flags)0x0);
    Debug::operator<<((Debug *)&item,
                      "Assertion !fullPath || fullPath.hasSuffix(\'/\') failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:125"
                     );
LAB_00113a09:
    Error::~Error((Error *)&item);
    abort();
  }
  local_e0 = &group->_groups;
  bVar5 = false;
LAB_001130ec:
  while( true ) {
    while( true ) {
      while( true ) {
        sVar11 = local_158._sizePlusFlags;
        if (((undefined1  [16])local_158 & (undefined1  [16])0x3fffffffffffffff) ==
            (undefined1  [16])0x0) {
          if (!bVar5) {
            (__return_storage_ptr__->first)._data = local_158._data;
            (__return_storage_ptr__->first)._sizePlusFlags = local_158._sizePlusFlags;
            __return_storage_ptr__->second = (char *)0x0;
            return __return_storage_ptr__;
          }
          (__return_storage_ptr__->first)._data = (char *)0x0;
          (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
          pcVar8 = "missing closing quotes for a multi-line value";
          goto LAB_0011395d;
        }
        local_f8 = local_158;
        local_e8 = local_158._data;
        BVar12 = Containers::BasicStringView<const_char>::findOr
                           (&local_158,'\n',
                            local_158._data + (local_158._sizePlusFlags & 0x3fffffffffffffff));
        local_f8 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                             (&local_158,BVar12._data);
        local_158 = Containers::BasicStringView<const_char>::suffix
                              (&local_158,
                               BVar12._data + (BVar12._sizePlusFlags & 0x3fffffffffffffff));
        bVar6 = Containers::BasicStringView<const_char>::hasSuffix(&local_f8,'\r');
        if (bVar6) {
          pbVar1 = (byte *)((long)&(this->_flags)._value + 2);
          *pbVar1 = *pbVar1 | 4;
        }
        if (!bVar5) break;
        item.key._M_dataplus._M_p = local_f8._data;
        item.key._M_string_length = local_f8._sizePlusFlags;
        BVar12 = Containers::BasicStringView<const_char>::trimmed
                           ((BasicStringView<const_char> *)&item);
        SVar13 = Containers::Literals::StringLiterals::operator____s("\"\"\"",3);
        bVar6 = Containers::operator==(BVar12,SVar13);
        if (bVar6) {
          pVVar2 = (group->_values).
                   super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          sVar3 = pVVar2[-1].value._M_string_length;
          if (sVar3 != 0) {
            psVar10 = &pVVar2[-1].value;
            if ((psVar10->_M_dataplus)._M_p[sVar3 - 1] != '\n') {
              poVar9 = Error::defaultOutput();
              Error::Error((Error *)&item,poVar9,(Flags)0x0);
              Debug::operator<<((Debug *)&item,
                                "Assertion group->_values.back().value.back() == \'\\n\' failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:148"
                               );
              goto LAB_00113a09;
            }
            std::__cxx11::string::resize((ulong)psVar10);
          }
          bVar5 = false;
        }
        else {
          bVar6 = Containers::BasicStringView<const_char>::hasSuffix(&local_f8,'\r');
          if (bVar6) {
            local_f8 = Containers::BasicStringView<const_char>::exceptSuffix(&local_f8,1);
          }
          Containers::BasicStringView::operator_cast_to_string
                    (&item.key,(BasicStringView *)&local_f8);
          std::__cxx11::string::append
                    ((string *)
                     &(group->_values).
                      super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].value);
          std::__cxx11::string::~string((string *)&item);
          std::__cxx11::string::push_back
                    ((char)(group->_values).
                           super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -0x20);
        }
      }
      local_f8 = Containers::BasicStringView<const_char>::trimmed(&local_f8);
      if (local_f8._data != (char *)0x0 &&
          ((undefined1  [16])local_f8 & (undefined1  [16])0x3fffffffffffffff) !=
          (undefined1  [16])0x0) break;
      if (((((this->_flags)._value & 0x10) == 0) && (local_158._data != (char *)0x0)) &&
         (((undefined1  [16])local_158 & (undefined1  [16])0x3fffffffffffffff) !=
          (undefined1  [16])0x0)) {
        std::
        vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
        ::emplace_back<>(&group->_values);
      }
    }
    bVar6 = Containers::BasicStringView<const_char>::hasPrefix(&local_f8,'[');
    if (bVar6) break;
    pcVar8 = Containers::BasicStringView<const_char>::operator[](&local_f8,0);
    if ((*pcVar8 == '#') ||
       (pcVar8 = Containers::BasicStringView<const_char>::operator[](&local_f8,0), *pcVar8 == ';'))
    {
      if (((this->_flags)._value & 0x10) == 0) {
        item.key._M_string_length = 0;
        item.key._M_dataplus._M_p = (pointer)&item.key.field_2;
        item.key.field_2._M_local_buf[0] = '\0';
        item.value._M_dataplus._M_p = (pointer)&item.value.field_2;
        item.value._M_string_length = 0;
        item.value.field_2._M_local_buf[0] = '\0';
        Containers::BasicStringView::operator_cast_to_string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyValue,
                   (BasicStringView *)&local_f8);
        std::__cxx11::string::operator=((string *)&item.value,(string *)&keyValue);
        std::__cxx11::string::~string((string *)&keyValue);
        std::
        vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
        ::push_back(&group->_values,&item);
        ConfigurationGroup::Value::~Value(&item);
      }
    }
    else {
      Containers::BasicStringView<const_char>::partition(&keyValue,&local_f8,'=');
      if ((keyValue.super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<const_char>_>
           .field_0._data[1]._data == (char *)0x0) ||
         ((keyValue.super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<const_char>_>
           .field_0._data[1]._sizePlusFlags & 0x3fffffffffffffff) == 0)) {
        (__return_storage_ptr__->first)._data = (char *)0x0;
        (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
        pcVar8 = "missing equals for a value";
        goto LAB_0011395d;
      }
      item.key._M_string_length = 0;
      item.key._M_dataplus._M_p = (pointer)&item.key.field_2;
      item.key.field_2._M_local_buf[0] = '\0';
      item.value._M_dataplus._M_p = (pointer)&item.value.field_2;
      item.value._M_string_length = 0;
      item.value.field_2._M_local_buf[0] = '\0';
      local_88._0_16_ =
           (undefined1  [16])
           Containers::BasicStringView<const_char>::trimmed
                     ((BasicStringView<const_char> *)&keyValue);
      Containers::BasicStringView::operator_cast_to_string
                (&local_70,(BasicStringView *)&local_88._small);
      std::__cxx11::string::operator=((string *)&item,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      local_88._0_16_ =
           (undefined1  [16])
           Containers::BasicStringView<const_char>::trimmed
                     (keyValue.
                      super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<const_char>_>
                      .field_0._data + 2);
      Containers::BasicStringView::operator_cast_to_string
                (&local_70,(BasicStringView *)&local_88._small);
      psVar10 = &item.value;
      std::__cxx11::string::operator=((string *)psVar10,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      bVar6 = std::operator==(psVar10,"\"\"\"");
      if (bVar6) {
        bVar5 = true;
        std::__cxx11::string::assign((char *)psVar10);
LAB_0011389e:
        bVar6 = true;
        std::
        vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
        ::push_back(&group->_values,&item);
      }
      else {
        if ((item.value._M_string_length == 0) || (*item.value._M_dataplus._M_p != '\"'))
        goto LAB_0011389e;
        if ((item.value._M_string_length != 1) &&
           (item.value._M_dataplus._M_p[item.value._M_string_length - 1] == '\"')) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&item.value);
          std::__cxx11::string::operator=((string *)&item.value,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          goto LAB_0011389e;
        }
        (__return_storage_ptr__->first)._data = (char *)0x0;
        (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
        __return_storage_ptr__->second = "missing closing quote for a value";
        bVar6 = false;
      }
      ConfigurationGroup::Value::~Value(&item);
      if (!bVar6) {
        return __return_storage_ptr__;
      }
    }
  }
  bVar6 = Containers::BasicStringView<const_char>::hasSuffix(&local_f8,']');
  if (!bVar6) {
    (__return_storage_ptr__->first)._data = (char *)0x0;
    (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
    pcVar8 = "missing closing bracket for a group header";
    goto LAB_0011395d;
  }
  item.key._0_16_ =
       Containers::BasicStringView<const_char>::slice
                 (&local_f8,1,(local_f8._sizePlusFlags & 0x3fffffffffffffff) - 1);
  nextGroup = Containers::BasicStringView<const_char>::trimmed((BasicStringView<const_char> *)&item)
  ;
  if ((nextGroup._data == (char *)0x0) ||
     (((undefined1  [16])nextGroup & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0)
     ) {
    local_e8 = (char *)0x0;
    sVar11 = 0x8000000000000000;
    pcVar8 = "empty group name";
  }
  else {
    SVar13._sizePlusFlags = fullPath._sizePlusFlags;
    SVar13._data = fullPath._data;
    bVar6 = Containers::BasicStringView<const_char>::hasPrefix(&nextGroup,SVar13);
    if (bVar6) {
      item.key._M_string_length = 0;
      item.key._M_dataplus._M_p = (pointer)&item.key.field_2;
      item.key.field_2._M_local_buf[0] = '\0';
      SVar14._sizePlusFlags = fullPath._sizePlusFlags;
      SVar14._data = fullPath._data;
      nextSubGroup = Containers::BasicStringView<const_char>::exceptPrefix(&nextGroup,SVar14);
      BVar12 = Containers::BasicStringView<const_char>::find(&nextSubGroup,'/');
      pcVar8 = BVar12._data;
      if (((undefined1  [16])BVar12 & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0
          || pcVar8 == (char *)0x0) {
        Containers::BasicStringView::operator_cast_to_string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyValue,
                   (BasicStringView *)&nextSubGroup);
        std::__cxx11::string::operator=((string *)&item,(string *)&keyValue);
        std::__cxx11::string::~string((string *)&keyValue);
        pCVar7 = (ConfigurationGroup *)operator_new(0x38);
        ConfigurationGroup::ConfigurationGroup
                  (pCVar7,(this->super_ConfigurationGroup)._configuration);
        item.value._M_dataplus._M_p = (pointer)pCVar7;
        std::
        vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
        ::emplace_back<Corrade::Utility::ConfigurationGroup::Group>(local_e0,(Group *)&item);
        _Var4._M_p = item.value._M_dataplus._M_p;
        SVar13 = local_158;
        local_e8 = nextGroup._data;
        sVar11 = nextGroup._sizePlusFlags;
        SVar14 = Containers::Literals::StringLiterals::operator____s("/",1);
        a._sizePlusFlags = sVar11;
        a._data = local_e8;
        Containers::operator+((String *)&local_88._small,a,SVar14);
        Containers::BasicStringView<char_const>::
        BasicStringView<Corrade::Containers::String,Corrade::Containers::ArrayView<char_const>>
                  ((BasicStringView<char_const> *)&local_40,(String *)&local_88._small,
                   (StringViewFlags)0x0);
        fullPath_00._sizePlusFlags = sStack_38;
        fullPath_00._data = local_40;
        parse((pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)&local_70,this
              ,SVar13,(ConfigurationGroup *)_Var4._M_p,fullPath_00);
        std::pair<Corrade::Containers::ArrayView<const_char>,_const_char_*>::
        pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*,_true>
                  ((pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> *)&keyValue,
                   (pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)&local_70
                  );
        Containers::String::~String((String *)&local_88._small);
        if (keyValue.
            super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<const_char>_>.field_0
            ._data[1]._data != (char *)0x0) {
LAB_001139b1:
          std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
          pair<Corrade::Containers::ArrayView<const_char>,_const_char_*,_true>
                    (__return_storage_ptr__,
                     (pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> *)&keyValue);
LAB_001139b9:
          std::__cxx11::string::~string((string *)&item);
          return __return_storage_ptr__;
        }
        Containers::BasicStringView<char_const>::
        BasicStringView<Corrade::Containers::ArrayView<char_const>&,Corrade::Containers::ArrayView<char_const>>
                  ((BasicStringView<char_const> *)&local_70,(ArrayView<const_char> *)&keyValue,
                   (StringViewFlags)0x0);
      }
      else {
        if (pcVar8 == nextSubGroup._data) {
          (__return_storage_ptr__->first)._data = (char *)0x0;
          (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
          __return_storage_ptr__->second = "empty subgroup name";
          goto LAB_001139b9;
        }
        local_70._0_16_ =
             Containers::BasicStringView<const_char>::prefix<const_char_*,_0>(&nextSubGroup,pcVar8);
        Containers::BasicStringView::operator_cast_to_string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyValue,
                   (BasicStringView *)&local_70);
        std::__cxx11::string::operator=((string *)&item,(string *)&keyValue);
        std::__cxx11::string::~string((string *)&keyValue);
        pCVar7 = (ConfigurationGroup *)operator_new(0x38);
        ConfigurationGroup::ConfigurationGroup
                  (pCVar7,(this->super_ConfigurationGroup)._configuration);
        item.value._M_dataplus._M_p = (pointer)pCVar7;
        std::
        vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
        ::emplace_back<Corrade::Utility::ConfigurationGroup::Group>(local_e0,(Group *)&item);
        _Var4._M_p = item.value._M_dataplus._M_p;
        local_50 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                             (&nextGroup,pcVar8 + (BVar12._sizePlusFlags & 0x3fffffffffffffff));
        in_00._sizePlusFlags = sVar11;
        in_00._data = local_e8;
        parse((pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)&local_70,this
              ,in_00,(ConfigurationGroup *)_Var4._M_p,local_50);
        std::pair<Corrade::Containers::ArrayView<const_char>,_const_char_*>::
        pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*,_true>
                  ((pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> *)&keyValue,
                   (pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)&local_70
                  );
        if (keyValue.
            super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<const_char>_>.field_0
            ._data[1]._data != (char *)0x0) goto LAB_001139b1;
        Containers::BasicStringView<char_const>::
        BasicStringView<Corrade::Containers::ArrayView<char_const>&,Corrade::Containers::ArrayView<char_const>>
                  ((BasicStringView<char_const> *)&local_70,(ArrayView<const_char> *)&keyValue,
                   (StringViewFlags)0x0);
      }
      local_158 = (StringView)local_70._0_16_;
      std::__cxx11::string::~string((string *)&item);
      goto LAB_001130ec;
    }
    pcVar8 = (char *)0x0;
  }
  (__return_storage_ptr__->first)._data = local_e8;
  (__return_storage_ptr__->first)._sizePlusFlags = sVar11;
LAB_0011395d:
  __return_storage_ptr__->second = pcVar8;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Containers::StringView, const char*> Configuration::parse(Containers::StringView in, ConfigurationGroup* group, const Containers::StringView fullPath) {
    CORRADE_INTERNAL_ASSERT(!fullPath || fullPath.hasSuffix('/'));

    /* Parse file */
    bool multiLineValue = false;
    while(!in.isEmpty()) {
        const Containers::StringView currentLine = in;

        /* Extract the line and ignore the newline character after it, if any */
        Containers::StringView buffer = in;
        const Containers::StringView end = in.findOr('\n', in.end());
        buffer = in.prefix(end.begin());
        in = in.suffix(end.end());

        /* Windows EOL */
        if(buffer.hasSuffix('\r'))
            _flags |= InternalFlag::WindowsEol;

        /* Multi-line value */
        if(multiLineValue) {
            /* End of multi-line value */
            if(Containers::StringView{buffer}.trimmed() == "\"\"\""_s) {
                /* Remove trailing newline, if present */
                if(!group->_values.back().value.empty()) {
                    CORRADE_INTERNAL_ASSERT(group->_values.back().value.back() == '\n');
                    group->_values.back().value.resize(group->_values.back().value.size()-1);
                }

                multiLineValue = false;
                continue;
            }

            /* Remove Windows EOL, if present */
            if(buffer.hasSuffix('\r')) buffer = buffer.exceptSuffix(1);

            /* Append it (with newline) to current value */
            group->_values.back().value += buffer;
            group->_values.back().value += '\n';
            continue;
        }

        /* Trim buffer */
        buffer = buffer.trimmed();

        /* Empty line */
        if(!buffer) {
            if(_flags & InternalFlag::SkipComments) continue;

            /* Save it only if this is not the last one */
            if(in) group->_values.emplace_back();

        /* Group header */
        } else if(buffer.hasPrefix('[')) {

            /* Check ending bracket */
            if(!buffer.hasSuffix(']'))
                return {nullptr, "missing closing bracket for a group header"};

            const Containers::StringView nextGroup = buffer.slice(1, buffer.size()-1).trimmed();

            if(!nextGroup)
                return {nullptr, "empty group name"};

            /* This is a subgroup of this one, parse recursively */
            if(nextGroup.hasPrefix(fullPath)) {
                ConfigurationGroup::Group g;

                /* If the subgroup has a shorthand for multiple nesting, call
                   parse() on this same line again but with nested group and
                   larger fullPath */
                const Containers::StringView nextSubGroup = nextGroup.exceptPrefix(fullPath);
                if(const Containers::StringView groupEnd = nextSubGroup.find('/')) {
                    if(groupEnd.begin() == nextSubGroup.begin())
                        return {nullptr, "empty subgroup name"};

                    g.name = nextSubGroup.prefix(groupEnd.begin());
                    g.group = new ConfigurationGroup(_configuration);
                    /* Add the group before attempting any other parsing, as it
                       could throw an exception and the group would otherwise
                       be leaked */
                    group->_groups.push_back(std::move(g));
                    std::pair<Containers::ArrayView<const char>, const char*> parsed = parse(currentLine, g.group, nextGroup.prefix(groupEnd .end()));
                    if(parsed.second) return parsed; /* Error, bubble up */
                    in = parsed.first;

                /* Otherwise call parse() on the next line */
                } else {
                    g.name = nextSubGroup;
                    g.group = new ConfigurationGroup(_configuration);
                    /* Add the group before attempting any other parsing, as it
                       could throw an exception and the group would otherwise
                       be leaked */
                    group->_groups.push_back(std::move(g));
                    std::pair<Containers::ArrayView<const char>, const char*> parsed = parse(in, g.group, nextGroup + "/"_s);
                    if(parsed.second) return parsed; /* Error, bubble up */
                    in = parsed.first;
                }

            /* Otherwise it's a subgroup of some parent, return the control
               back to caller (again with this line) */
            } else return {currentLine, nullptr};

        /* Comment */
        } else if(buffer[0] == '#' || buffer[0] == ';') {
            if(_flags & InternalFlag::SkipComments) continue;

            ConfigurationGroup::Value item;
            item.value = buffer;
            group->_values.push_back(item);

        /* Key/value pair */
        } else {
            const Containers::Array3<Containers::StringView> keyValue = buffer.partition('=');
            if(!keyValue[1])
                return {nullptr, "missing equals for a value"};

            ConfigurationGroup::Value item;
            item.key = keyValue[0].trimmed();
            item.value = keyValue[2].trimmed();

            /* Start of multi-line value */
            if(item.value == "\"\"\"") {
                item.value = "";
                multiLineValue = true;

            /* Remove quotes, if present */
            /** @todo Check `"` characters better */
            } else if(!item.value.empty() && item.value[0] == '"') {
                if(item.value.size() < 2 || item.value[item.value.size()-1] != '"')
                    return {nullptr, "missing closing quote for a value"};

                item.value = item.value.substr(1, item.value.size()-2);
            }

            group->_values.push_back(item);
        }
    }

    if(multiLineValue)
        return {nullptr, "missing closing quotes for a multi-line value"};

    /* This was the last group */
    return {in, nullptr};
}